

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O1

bool __thiscall
rapidjson::
GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
::Int64(GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
        *this,int64_t i)

{
  ushort uVar1;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *pGVar2;
  uint16_t uVar3;
  
  pGVar2 = internal::Stack<rapidjson::CrtAllocator>::
           Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                     (&this->stack_,1);
  (pGVar2->data_).n = (Number)0x0;
  (pGVar2->data_).s.str = (Ch *)0x0;
  (pGVar2->data_).n = (Number)i;
  (pGVar2->data_).f.flags = 0x96;
  if (i < 0) {
    uVar3 = 0xb6;
    if (i < -0x80000000) {
      return true;
    }
  }
  else {
    uVar1 = (ushort)((ulong)i >> 0x20 == 0) << 6;
    (pGVar2->data_).f.flags = uVar1 | 0x196;
    if (0x7fffffff < (ulong)i) {
      return true;
    }
    uVar3 = uVar1 | 0x1b6;
  }
  (pGVar2->data_).f.flags = uVar3;
  return true;
}

Assistant:

bool Int64(int64_t i) { new (stack_.template Push<ValueType>()) ValueType(i); return true; }